

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O0

bool_t rngTestFIPS3(octet *buf)

{
  byte *in_RDI;
  size_t i;
  size_t l;
  octet b;
  word s [2] [7];
  octet in_stack_ffffffffffffff4f;
  bool bVar1;
  void *in_stack_ffffffffffffff50;
  ulong local_a0;
  ulong local_90;
  ulong local_88;
  byte local_79;
  long local_78 [4];
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  ulong local_18;
  ulong local_10;
  byte *local_8;
  
  local_8 = in_RDI;
  memSet(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4f,0x128560);
  local_79 = *local_8 & 1;
  local_88 = 1;
  for (local_90 = 1; local_90 < 20000; local_90 = local_90 + 1) {
    if (((int)(uint)local_8[local_90 >> 3] >> ((byte)local_90 & 7) & 1U) == (uint)local_79) {
      local_88 = local_88 + 1;
    }
    else {
      if (local_88 < 6) {
        local_a0 = local_88;
      }
      else {
        local_a0 = 6;
      }
      local_78[(ulong)local_79 * 7 + local_a0] = local_78[(ulong)local_79 * 7 + local_a0] + 1;
      local_79 = (local_79 != 0 ^ 0xffU) & 1;
      local_88 = 1;
    }
  }
  if (5 < local_88) {
    local_88 = 6;
  }
  local_78[(ulong)local_79 * 7 + local_88] = local_78[(ulong)local_79 * 7 + local_88] + 1;
  bVar1 = false;
  if ((((((0x90a < (ulong)local_78[1]) && (bVar1 = false, (ulong)local_78[1] < 0xa7e)) &&
        (bVar1 = false, 0x90a < local_38)) &&
       (((bVar1 = false, local_38 < 0xa7e && (bVar1 = false, 0x459 < (ulong)local_78[2])) &&
        ((bVar1 = false, (ulong)local_78[2] < 0x56b &&
         ((bVar1 = false, 0x459 < local_30 && (bVar1 = false, local_30 < 0x56b)))))))) &&
      ((bVar1 = false, 0x20e < (ulong)local_78[3] &&
       ((((((bVar1 = false, (ulong)local_78[3] < 0x2d4 && (bVar1 = false, 0x20e < local_28)) &&
           (bVar1 = false, local_28 < 0x2d4)) &&
          ((bVar1 = false, 0xef < local_58 && (bVar1 = false, local_58 < 0x181)))) &&
         ((bVar1 = false, 0xef < local_20 &&
          ((bVar1 = false, local_20 < 0x181 && (bVar1 = false, 0x66 < local_50)))))) &&
        (bVar1 = false, local_50 < 0xd2)))))) &&
     ((((bVar1 = false, 0x66 < local_18 && (bVar1 = false, local_18 < 0xd2)) &&
       (bVar1 = false, 0x66 < local_48)) &&
      ((bVar1 = false, local_48 < 0xd2 && (bVar1 = false, 0x66 < local_10)))))) {
    bVar1 = local_10 < 0xd2;
  }
  return (bool_t)bVar1;
}

Assistant:

bool_t rngTestFIPS3(const octet buf[2500])
{
	word s[2][7];
	octet b;
	size_t l;
	size_t i;
	ASSERT(memIsValid(buf, 2500));
	memSetZero(s, sizeof(s));
	b = buf[0] & 1;
	l = 1;
	for (i = 1; i < 20000; ++i)
		if ((buf[i / 8] >> i % 8 & 1) == b)
			++l;
		else
			++s[b][MIN2(l, 6)], b = !b, l = 1;
	++s[b][MIN2(l, 6)];
	return 2315 <= s[0][1] && s[0][1] <= 2685 &&
		2315 <= s[1][1] && s[1][1] <= 2685 &&
		1114 <= s[0][2] && s[0][2] <= 1386 &&
		1114 <= s[1][2] && s[1][2] <= 1386 &&
		527 <= s[0][3] && s[0][3] <= 723 &&
		527 <= s[1][3] && s[1][3] <= 723 &&
		240 <= s[0][4] && s[0][4] <= 384 &&
		240 <= s[1][4] && s[1][4] <= 384 &&
		103 <= s[0][5] && s[0][5] <= 209 &&
		103 <= s[1][5] && s[1][5] <= 209 &&
		103 <= s[0][6] && s[0][6] <= 209 &&
		103 <= s[1][6] && s[1][6] <= 209;
}